

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

int nifti_read_collapsed_image(nifti_image *nim,int *dims,void **data)

{
  char *data_00;
  int iVar1;
  uint uVar2;
  void *pvVar3;
  znzFile file;
  size_t base_offset;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  znzFile fp;
  int prods [8];
  int pivots [8];
  
  if (((nim == (nifti_image *)0x0) || (dims == (int *)0x0)) || (data == (void **)0x0)) {
    fprintf(_stderr,"** nifti_RCI: bad params %p, %p, %p\n",nim,dims,data);
  }
  else {
    if (2 < g_opts_0) {
      fwrite("-d read_collapsed_image:\n        dims =",0x27,1,_stderr);
      for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
        fprintf(_stderr," %3d",(ulong)(uint)dims[lVar7]);
      }
      fwrite("\n   nim->dims =",0xf,1,_stderr);
      for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
        fprintf(_stderr," %3d",(ulong)(uint)nim->dim[lVar7]);
      }
      fputc(10,_stderr);
    }
    iVar1 = nifti_nim_is_valid(nim,(uint)(0 < g_opts_0));
    if (iVar1 == 0) {
      fprintf(_stderr,"** invalid nim (file is \'%s\')\n",nim->fname);
    }
    else {
      uVar2 = nim->dim[0];
      uVar5 = 0;
      uVar6 = 0;
      if (0 < (int)uVar2) {
        uVar6 = (ulong)uVar2;
      }
      for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        if (nim->dim[uVar5 + 1] <= dims[uVar5 + 1]) {
          fprintf(_stderr,"** nifti_RCI: dims[%d] >= nim->dim[%d] (%d,%d)\n",(ulong)((int)uVar5 + 1)
                 );
          return -1;
        }
      }
      uVar5 = 0;
      while (0 < (int)uVar2) {
        prods[uVar5] = 1;
        iVar1 = 1;
        uVar6 = (ulong)uVar2;
        while (uVar6 != 0) {
          if ((nim->dim[uVar6] != 1) && (dims[uVar6] != -1)) goto LAB_001104f1;
          iVar1 = iVar1 * nim->dim[uVar6];
          prods[uVar5] = iVar1;
          uVar6 = uVar6 - 1;
        }
        uVar6 = 0;
LAB_001104f1:
        pivots[uVar5] = (int)uVar6;
        uVar5 = uVar5 + 1;
        uVar2 = (int)uVar6 - 1;
      }
      uVar6 = uVar5 & 0xffffffff;
      if (prods[uVar6 + 7] != 0) {
        pivots[uVar6] = 0;
        prods[uVar6] = 1;
        uVar5 = (ulong)((int)uVar5 + 1);
      }
      iVar1 = (int)uVar5;
      if (2 < g_opts_0) {
        fwrite("+d pivot list created, pivots :",0x1f,1,_stderr);
        uVar6 = 0;
        if (0 < iVar1) {
          uVar6 = uVar5 & 0xffffffff;
        }
        for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
          fprintf(_stderr," %d",(ulong)(uint)pivots[uVar8]);
        }
        fwrite(", prods :",9,1,_stderr);
        for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
          fprintf(_stderr," %d",(ulong)(uint)prods[uVar8]);
        }
        fputc(10,_stderr);
      }
      uVar2 = nim->nbyper;
      if ((iVar1 - 9U < 0xfffffff8) || ((int)uVar2 < 0)) {
        fprintf(_stderr,"** rci_am: bad params, %d, %d\n",(ulong)uVar2,uVar5 & 0xffffffff);
      }
      else {
        iVar4 = 1;
        for (uVar6 = 0; (uVar5 & 0xffffffff) != uVar6; uVar6 = uVar6 + 1) {
          iVar4 = iVar4 * prods[uVar6];
        }
        uVar2 = iVar4 * uVar2;
        if (*data == (void *)0x0) {
          if (1 < g_opts_0) {
            fprintf(_stderr,"+d alloc %d (= %d x %d) bytes for collapsed image\n",(ulong)uVar2);
          }
          pvVar3 = malloc((long)(int)uVar2);
          *data = pvVar3;
          if (pvVar3 == (void *)0x0) {
            fprintf(_stderr,"** rci_am: failed to alloc %d bytes for data\n",(ulong)uVar2);
            return -1;
          }
        }
        else if (1 < g_opts_0) {
          fprintf(_stderr,"-d rci_am: *data already set, need %d (%d x %d) bytes\n",(ulong)uVar2);
        }
        if ((int)uVar2 < 0) {
          return -1;
        }
        file = nifti_image_load_prep(nim);
        data_00 = (char *)*data;
        fp = file;
        if (file == (znzFile)0x0) {
          free(data_00);
          *data = (void *)0x0;
        }
        else {
          base_offset = znztell(file);
          iVar1 = rci_read_data(nim,pivots,prods,iVar1,dims,data_00,file,base_offset);
          Xznzclose(&fp);
          if (-1 < iVar1) {
            if (1 < g_opts_0) {
              fprintf(_stderr,"+d read %d bytes of collapsed image from %s\n",(ulong)uVar2,
                      nim->fname);
              return uVar2;
            }
            return uVar2;
          }
          free(*data);
          *data = (void *)0x0;
        }
      }
    }
  }
  return -1;
}

Assistant:

int nifti_read_collapsed_image( nifti_image * nim, const int dims [8],
                                void ** data )
{
   znzFile fp;
   int     pivots[8], prods[8], nprods; /* sizes are bounded by dims[], so 8 */
   int     c, bytes;

   /** - check pointers for sanity */
   if( !nim || !dims || !data ){
      fprintf(stderr,"** nifti_RCI: bad params %p, %p, %p\n",
              (void *)nim, (const void *)dims, (void *)data);
      return -1;
   }

   if( g_opts.debug > 2 ){
      fprintf(stderr,"-d read_collapsed_image:\n        dims =");
      for(c = 0; c < 8; c++) fprintf(stderr," %3d", dims[c]);
      fprintf(stderr,"\n   nim->dims =");
      for(c = 0; c < 8; c++) fprintf(stderr," %3d", nim->dim[c]);
      fputc('\n', stderr);
   }

   /** - verify that dim[] makes sense */
   if( ! nifti_nim_is_valid(nim, g_opts.debug > 0) ){
      fprintf(stderr,"** invalid nim (file is '%s')\n", nim->fname );
      return -1;
   }

   /** - verify that dims[] makes sense for this dataset */
   for( c = 1; c <= nim->dim[0]; c++ ){
      if( dims[c] >= nim->dim[c] ){
         fprintf(stderr,"** nifti_RCI: dims[%d] >= nim->dim[%d] (%d,%d)\n",
                 c, c, dims[c], nim->dim[c]);
         return -1;
      }
   }

   /** - prepare pivot list - pivots are fixed indices */
   if( make_pivot_list(nim, dims, pivots, prods, &nprods) < 0 ) return -1;

   bytes = rci_alloc_mem(data, prods, nprods, nim->nbyper);
   if( bytes < 0 ) return -1;

   /** - open the image file for reading at the appropriate offset */
   fp = nifti_image_load_prep( nim );
   if( ! fp ){ free(*data);  *data = NULL;  return -1; }     /* failure */

   /** - call the recursive reading function, passing nim, the pivot info,
         location to store memory, and file pointer and position */
   c = rci_read_data(nim, pivots,prods,nprods,dims,
                     (char *)*data, fp, znztell(fp));
   znzclose(fp);   /* in any case, close the file */
   if( c < 0 ){ free(*data);  *data = NULL;  return -1; }    /* failure */

   if( g_opts.debug > 1 )
      fprintf(stderr,"+d read %d bytes of collapsed image from %s\n",
              bytes, nim->fname);

   return bytes;
}